

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

int __thiscall
cmCPackGenerator::InstallProjectViaInstalledDirectories
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCPackLog *pcVar2;
  pointer pcVar3;
  char cVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  bool bVar7;
  char *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long *plVar11;
  undefined8 *puVar12;
  ulong *remote;
  pointer pbVar13;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 uVar14;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  int iVar15;
  pointer this_00;
  _List_node_base *p_Var16;
  string *inName;
  string targetFile;
  string inFile;
  string filePath;
  string inFileRelative;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreFilesRegexString;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  symlinkedFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installDirectoriesVector;
  string subdir;
  string findExpr;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> ignoreFilesRegex;
  ostringstream cmCPackLog_msg;
  Glob gl;
  string local_380;
  cmCPackGenerator *local_360;
  string local_358;
  string local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  undefined1 local_2f8 [40];
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> local_258;
  pointer local_238;
  string *local_230;
  string local_228;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [4];
  ios_base local_198 [72];
  char *local_150;
  undefined1 local_90 [81];
  bool local_3f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_258.super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
  _M_impl.super__Vector_impl_data._M_start = (RegularExpression *)0x0;
  local_258.super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
  _M_impl.super__Vector_impl_data._M_finish = (RegularExpression *)0x0;
  local_258.super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208._0_8_ = &local_1f8;
  local_230 = tempInstallDirectory;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"CPACK_IGNORE_FILES","");
  local_360 = this;
  pcVar8 = GetOption(this,(string *)local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._0_8_ != &local_1f8) {
    operator_delete((void *)local_208._0_8_,local_1f8._M_allocated_capacity + 1);
  }
  if (pcVar8 != (char *)0x0) {
    local_2f8._0_8_ = (pointer)0x0;
    local_2f8._8_8_ = (pointer)0x0;
    local_2f8._16_8_ = (pointer)0x0;
    local_208._0_8_ = &local_1f8;
    sVar9 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,pcVar8,pcVar8 + sVar9);
    cmSystemTools::ExpandListArgument
              ((string *)local_208,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2f8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._0_8_ != &local_1f8) {
      operator_delete((void *)local_208._0_8_,local_1f8._M_allocated_capacity + 1);
    }
    if (local_2f8._0_8_ != local_2f8._8_8_) {
      pbVar13 = (pointer)local_2f8._0_8_;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Create ignore files regex for: ",0x1f);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,(pbVar13->_M_dataplus)._M_p,
                             pbVar13->_M_string_length);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        pcVar2 = local_360->Logger;
        std::__cxx11::stringbuf::str();
        uVar14 = local_90._0_8_;
        sVar9 = strlen((char *)local_90._0_8_);
        cmCPackLog::Log(pcVar2,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x14d,(char *)uVar14,sVar9);
        if ((GlobInternals *)local_90._0_8_ != (GlobInternals *)(local_90 + 0x10)) {
          operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
        std::ios_base::~ios_base(local_198);
        pcVar8 = (pbVar13->_M_dataplus)._M_p;
        local_150 = (char *)0x0;
        if (pcVar8 != (char *)0x0) {
          cmsys::RegularExpression::compile((RegularExpression *)local_208,pcVar8);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
        emplace_back<cmsys::RegularExpression>(&local_258,(RegularExpression *)local_208);
        if (local_150 != (char *)0x0) {
          operator_delete__(local_150);
        }
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 != (pointer)local_2f8._8_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2f8);
  }
  local_208._0_8_ = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_208,"CPACK_INSTALLED_DIRECTORIES","");
  pcVar8 = GetOption(local_360,(string *)local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._0_8_ != &local_1f8) {
    operator_delete((void *)local_208._0_8_,local_1f8._M_allocated_capacity + 1);
  }
  iVar15 = 1;
  if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
    local_2b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208._0_8_ = &local_1f8;
    sVar9 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,pcVar8,pcVar8 + sVar9);
    cmSystemTools::ExpandListArgument((string *)local_208,&local_2b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._0_8_ != &local_1f8) {
      operator_delete((void *)local_208._0_8_,local_1f8._M_allocated_capacity + 1);
    }
    if (((int)local_2b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
         (int)local_2b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start & 0x20U) == 0) {
      if (local_2b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_2b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_38 = &local_360->files;
        pbVar13 = local_2b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_2d0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_2d0;
          local_2d0._M_impl._M_node._M_size = 0;
          local_2d0._M_impl._M_node.super__List_node_base._M_prev =
               local_2d0._M_impl._M_node.super__List_node_base._M_next;
          local_238 = pbVar13;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Find files",10);
          cVar4 = (char)(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_208;
          std::ios::widen((char)*(undefined8 *)(local_208._0_8_ + -0x18) + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
          pcVar2 = local_360->Logger;
          std::__cxx11::stringbuf::str();
          uVar14 = local_90._0_8_;
          sVar9 = strlen((char *)local_90._0_8_);
          cmCPackLog::Log(pcVar2,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x167,(char *)uVar14,sVar9);
          if ((GlobInternals *)local_90._0_8_ != (GlobInternals *)(local_90 + 0x10)) {
            operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
          std::ios_base::~ios_base(local_198);
          cmsys::Glob::Glob((Glob *)local_90);
          pbVar13 = local_238;
          local_2f8._0_8_ = local_2f8 + 0x10;
          pcVar3 = (local_238->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2f8,pcVar3,pcVar3 + local_238->_M_string_length);
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          pcVar3 = pbVar13[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_298,pcVar3,pcVar3 + pbVar13[1]._M_string_length);
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_278,local_2f8._0_8_,
                     (char *)((long)&((_Alloc_hider *)local_2f8._8_8_)->_M_p +
                             (long)&((_Alloc_hider *)local_2f8._0_8_)->_M_p));
          std::__cxx11::string::append((char *)&local_278);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"- Install directory: ",0x15);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,(char *)local_2f8._0_8_,local_2f8._8_8_);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          pcVar2 = local_360->Logger;
          std::__cxx11::stringbuf::str();
          _Var5._M_p = local_358._M_dataplus._M_p;
          sVar9 = strlen(local_358._M_dataplus._M_p);
          cmCPackLog::Log(pcVar2,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x16f,_Var5._M_p,sVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
          std::ios_base::~ios_base(local_198);
          local_90[8] = true;
          local_3f = true;
          bVar6 = cmsys::Glob::FindFiles((Glob *)local_90,&local_278,(GlobMessages *)0x0);
          if (!bVar6) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"Cannot find any files in the installed directory",0x30)
            ;
            std::ios::widen((char)(ostream *)local_208 +
                            (char)*(undefined8 *)(local_208._0_8_ + -0x18));
            std::ostream::put((char)local_208);
            std::ostream::flush();
            pcVar2 = local_360->Logger;
            std::__cxx11::stringbuf::str();
            _Var5._M_p = local_358._M_dataplus._M_p;
            sVar9 = strlen(local_358._M_dataplus._M_p);
            cmCPackLog::Log(pcVar2,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x175,_Var5._M_p,sVar9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
            std::ios_base::~ios_base(local_198);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer)local_2f8._0_8_ != (pointer)(local_2f8 + 0x10)) {
              operator_delete((void *)local_2f8._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_2f8._16_8_)->_M_p + 1));
            }
            cmsys::Glob::~Glob((Glob *)local_90);
            std::__cxx11::
            _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::_M_clear(&local_2d0);
            goto LAB_0023bf42;
          }
          __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_90);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(local_38,__x);
          uVar14 = extraout_RDX;
          for (inName = (local_360->files).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              inName != (local_360->files).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish; inName = inName + 1) {
            local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
            pcVar3 = (inName->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_358,pcVar3,pcVar3 + inName->_M_string_length);
            bVar6 = cmsys::SystemTools::FileIsDirectory(inName);
            if (bVar6) {
              std::__cxx11::string::push_back((char)&local_358);
            }
            if (local_258.
                super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_258.
                super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0023b167:
              local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
              pcVar3 = (local_230->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_338,pcVar3,pcVar3 + local_230->_M_string_length);
              std::operator+(&local_318,"/",&local_298);
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_318);
              local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
              remote = (ulong *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)remote) {
                local_380.field_2._M_allocated_capacity = *remote;
                local_380.field_2._8_8_ = plVar11[3];
              }
              else {
                local_380.field_2._M_allocated_capacity = *remote;
                local_380._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_380._M_string_length = plVar11[1];
              *plVar11 = (long)remote;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              cmSystemTools::RelativePath_abi_cxx11_
                        (&local_228,(cmSystemTools *)local_2f8._0_8_,(inName->_M_dataplus)._M_p,
                         (char *)remote);
              uVar14 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._M_dataplus._M_p != &local_380.field_2) {
                uVar14 = local_380.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar14 < local_228._M_string_length + local_380._M_string_length) {
                uVar14 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228._M_dataplus._M_p != &local_228.field_2) {
                  uVar14 = local_228.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar14 < local_228._M_string_length + local_380._M_string_length)
                goto LAB_0023b26b;
                puVar12 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_228,0,(char *)0x0,
                                     (ulong)local_380._M_dataplus._M_p);
              }
              else {
LAB_0023b26b:
                puVar12 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_380,(ulong)local_228._M_dataplus._M_p);
              }
              local_208._0_8_ = &local_1f8;
              paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(puVar12 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 == paVar1) {
                local_1f8._M_allocated_capacity = paVar1->_M_allocated_capacity;
                local_1f8._8_8_ = puVar12[3];
              }
              else {
                local_1f8._M_allocated_capacity = paVar1->_M_allocated_capacity;
                local_208._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar12;
              }
              local_208._8_8_ = puVar12[1];
              *puVar12 = paVar1;
              puVar12[1] = 0;
              paVar1->_M_local_buf[0] = '\0';
              std::__cxx11::string::_M_append((char *)&local_338,local_208._0_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._0_8_ != &local_1f8) {
                operator_delete((void *)local_208._0_8_,local_1f8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_228._M_dataplus._M_p != &local_228.field_2) {
                operator_delete(local_228._M_dataplus._M_p,
                                local_228.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._M_dataplus._M_p != &local_380.field_2) {
                operator_delete(local_380._M_dataplus._M_p,
                                local_380.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._M_dataplus._M_p != &local_318.field_2) {
                operator_delete(local_318._M_dataplus._M_p,
                                local_318.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"Copy file: ",0xb);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_208,local_358._M_dataplus._M_p,
                                   local_358._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," -> ",4);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,local_338._M_dataplus._M_p,local_338._M_string_length);
              std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
              pcVar2 = local_360->Logger;
              std::__cxx11::stringbuf::str();
              _Var5._M_p = local_380._M_dataplus._M_p;
              sVar9 = strlen(local_380._M_dataplus._M_p);
              pcVar8 = (char *)0x196;
              cmCPackLog::Log(pcVar2,4,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x196,_Var5._M_p,sVar9);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._M_dataplus._M_p != &local_380.field_2) {
                operator_delete(local_380._M_dataplus._M_p,
                                local_380.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
              std::ios_base::~ios_base(local_198);
              bVar6 = cmsys::SystemTools::FileIsSymlink(&local_358);
              if (bVar6) {
                local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
                local_380._M_string_length = 0;
                local_380.field_2._M_allocated_capacity =
                     local_380.field_2._M_allocated_capacity & 0xffffffffffffff00;
                cmSystemTools::RelativePath_abi_cxx11_
                          (&local_318,(cmSystemTools *)local_2f8._0_8_,local_358._M_dataplus._M_p,
                           pcVar8);
                cmsys::SystemTools::ReadSymlink(&local_358,&local_380);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_208,&local_380,&local_318);
                std::__cxx11::
                list<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                ::_M_insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((list<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                            *)&local_2d0,(iterator)&local_2d0,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_208);
                uVar14 = extraout_RDX_02;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_p != local_1d8) {
                  operator_delete(local_1e8._M_p,(ulong)(local_1d8[0]._M_allocated_capacity + 1));
                  uVar14 = extraout_RDX_03;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208._0_8_ != &local_1f8) {
                  operator_delete((void *)local_208._0_8_,local_1f8._M_allocated_capacity + 1);
                  uVar14 = extraout_RDX_04;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318._M_dataplus._M_p != &local_318.field_2) {
                  operator_delete(local_318._M_dataplus._M_p,
                                  local_318.field_2._M_allocated_capacity + 1);
                  uVar14 = extraout_RDX_05;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_380._M_dataplus._M_p != &local_380.field_2) {
                  operator_delete(local_380._M_dataplus._M_p,
                                  local_380.field_2._M_allocated_capacity + 1);
                  uVar14 = extraout_RDX_06;
                }
                iVar15 = 0;
              }
              else {
                bVar6 = cmSystemTools::CopyFileIfDifferent
                                  (local_358._M_dataplus._M_p,local_338._M_dataplus._M_p);
                if (bVar6) {
                  bVar6 = cmSystemTools::CopyFileTime
                                    (local_358._M_dataplus._M_p,local_338._M_dataplus._M_p);
                  iVar15 = 0;
                  uVar14 = extraout_RDX_07;
                  if (bVar6) goto LAB_0023b6b5;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,"Problem copying file: ",0x16);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_208,local_358._M_dataplus._M_p,
                                     local_358._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," -> ",4);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,local_338._M_dataplus._M_p,local_338._M_string_length);
                std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                pcVar2 = local_360->Logger;
                std::__cxx11::stringbuf::str();
                _Var5._M_p = local_380._M_dataplus._M_p;
                sVar9 = strlen(local_380._M_dataplus._M_p);
                cmCPackLog::Log(pcVar2,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x1a9,_Var5._M_p,sVar9);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_380._M_dataplus._M_p != &local_380.field_2) {
                  operator_delete(local_380._M_dataplus._M_p,
                                  local_380.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
                std::ios_base::~ios_base(local_198);
                iVar15 = 1;
                uVar14 = extraout_RDX_08;
              }
LAB_0023b6b5:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_338._M_dataplus._M_p != &local_338.field_2) {
                operator_delete(local_338._M_dataplus._M_p,
                                local_338.field_2._M_allocated_capacity + 1);
                uVar14 = extraout_RDX_09;
              }
            }
            else {
              bVar6 = false;
              this_00 = local_258.
                        super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                while( true ) {
                  bVar7 = cmsys::RegularExpression::find(this_00,local_358._M_dataplus._M_p);
                  if (bVar7) break;
                  this_00 = this_00 + 1;
                  if (this_00 ==
                      local_258.
                      super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    iVar15 = 0x14;
                    uVar14 = extraout_RDX_00;
                    if (!bVar6) goto LAB_0023b167;
                    goto LAB_0023b6d1;
                  }
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,"Ignore file: ",0xd);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_208,local_358._M_dataplus._M_p,
                                     local_358._M_string_length);
                std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                pcVar2 = local_360->Logger;
                std::__cxx11::stringbuf::str();
                _Var5._M_p = local_338._M_dataplus._M_p;
                sVar9 = strlen(local_338._M_dataplus._M_p);
                cmCPackLog::Log(pcVar2,2,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x18a,_Var5._M_p,sVar9);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_338._M_dataplus._M_p != &local_338.field_2) {
                  operator_delete(local_338._M_dataplus._M_p,
                                  local_338.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
                std::ios_base::~ios_base(local_198);
                this_00 = this_00 + 1;
                bVar6 = true;
              } while (this_00 !=
                       local_258.
                       super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
              iVar15 = 0x14;
              uVar14 = extraout_RDX_01;
            }
LAB_0023b6d1:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1
                             );
              uVar14 = extraout_RDX_10;
            }
            if ((iVar15 != 0x14) && (iVar15 != 0)) {
              bVar6 = false;
              goto LAB_0023bd94;
            }
          }
          if (local_2d0._M_impl._M_node.super__List_node_base._M_next ==
              (_List_node_base *)&local_2d0) {
LAB_0023bd8e:
            bVar6 = true;
          }
          else {
            cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                      (&local_358,(SystemTools *)0x1,SUB81(uVar14,0));
            local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
            pcVar3 = (local_230->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_338,pcVar3,pcVar3 + local_230->_M_string_length);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_208,"/",&local_298);
            std::__cxx11::string::_M_append((char *)&local_338,local_208._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._0_8_ != &local_1f8) {
              operator_delete((void *)local_208._0_8_,local_1f8._M_allocated_capacity + 1);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"Change dir to: ",0xf);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208,local_338._M_dataplus._M_p,
                                 local_338._M_string_length);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            pcVar2 = local_360->Logger;
            std::__cxx11::stringbuf::str();
            _Var5._M_p = local_380._M_dataplus._M_p;
            sVar9 = strlen(local_380._M_dataplus._M_p);
            cmCPackLog::Log(pcVar2,4,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x1b5,_Var5._M_p,sVar9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != &local_380.field_2) {
              operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
            std::ios_base::~ios_base(local_198);
            cmsys::SystemTools::ChangeDirectory(&local_338);
            for (p_Var16 = local_2d0._M_impl._M_node.super__List_node_base._M_next;
                p_Var16 != (_List_node_base *)&local_2d0;
                p_Var16 = (((_List_impl *)&p_Var16->_M_next)->_M_node).super__List_node_base._M_next
                ) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"Will create a symlink: ",0x17);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_208,
                                   (char *)(((_List_impl *)&p_Var16[3]._M_next)->_M_node).
                                           super__List_node_base._M_next,(long)p_Var16[3]._M_prev);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"--> ",4);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(char *)p_Var16[1]._M_next,(long)p_Var16[1]._M_prev);
              std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
              pcVar2 = local_360->Logger;
              std::__cxx11::stringbuf::str();
              _Var5._M_p = local_380._M_dataplus._M_p;
              sVar9 = strlen(local_380._M_dataplus._M_p);
              cmCPackLog::Log(pcVar2,4,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x1bd,_Var5._M_p,sVar9);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._M_dataplus._M_p != &local_380.field_2) {
                operator_delete(local_380._M_dataplus._M_p,
                                local_380.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
              std::ios_base::~ios_base(local_198);
              cmsys::SystemTools::GetFilenamePath(&local_380,(string *)(p_Var16 + 3));
              if (local_380._M_string_length != 0) {
                bVar6 = cmsys::SystemTools::MakeDirectory(&local_380);
                if (!bVar6) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,"Cannot create dir: ",0x13);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_208,local_380._M_dataplus._M_p,
                                       local_380._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,"\nTrying to create symlink: ",0x1b);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar10,(char *)(((_List_impl *)&p_Var16[3]._M_next)->_M_node
                                                       ).super__List_node_base._M_next,
                                       (long)p_Var16[3]._M_prev);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"--> ",4);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar10,(char *)p_Var16[1]._M_next,(long)p_Var16[1]._M_prev);
                  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  pcVar2 = local_360->Logger;
                  std::__cxx11::stringbuf::str();
                  _Var5._M_p = local_318._M_dataplus._M_p;
                  sVar9 = strlen(local_318._M_dataplus._M_p);
                  cmCPackLog::Log(pcVar2,0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                                  ,0x1c8,_Var5._M_p,sVar9);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_318._M_dataplus._M_p != &local_318.field_2) {
                    operator_delete(local_318._M_dataplus._M_p,
                                    local_318.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
                  std::ios_base::~ios_base(local_198);
                }
              }
              bVar6 = cmsys::SystemTools::CreateSymlink
                                ((string *)(p_Var16 + 1),(string *)(p_Var16 + 3));
              if (!bVar6) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,"Cannot create symlink: ",0x17);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_208,(char *)p_Var16[3]._M_next,
                                     (long)p_Var16[3]._M_prev);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"--> ",4);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(char *)p_Var16[1]._M_next,(long)p_Var16[1]._M_prev);
                std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                pcVar2 = local_360->Logger;
                std::__cxx11::stringbuf::str();
                _Var5._M_p = local_318._M_dataplus._M_p;
                sVar9 = strlen(local_318._M_dataplus._M_p);
                cmCPackLog::Log(pcVar2,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x1cf,_Var5._M_p,sVar9);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318._M_dataplus._M_p != &local_318.field_2) {
                  operator_delete(local_318._M_dataplus._M_p,
                                  local_318.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
                std::ios_base::~ios_base(local_198);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_380._M_dataplus._M_p != &local_380.field_2) {
                  operator_delete(local_380._M_dataplus._M_p,
                                  local_380.field_2._M_allocated_capacity + 1);
                }
                bVar6 = false;
                goto LAB_0023bd52;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._M_dataplus._M_p != &local_380.field_2) {
                operator_delete(local_380._M_dataplus._M_p,
                                local_380.field_2._M_allocated_capacity + 1);
              }
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"Going back to: ",0xf);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_208,local_358._M_dataplus._M_p,
                                 local_358._M_string_length);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            pcVar2 = local_360->Logger;
            std::__cxx11::stringbuf::str();
            _Var5._M_p = local_380._M_dataplus._M_p;
            sVar9 = strlen(local_380._M_dataplus._M_p);
            cmCPackLog::Log(pcVar2,4,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x1d4,_Var5._M_p,sVar9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_dataplus._M_p != &local_380.field_2) {
              operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
            std::ios_base::~ios_base(local_198);
            bVar6 = true;
            cmsys::SystemTools::ChangeDirectory(&local_358);
LAB_0023bd52:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338._M_dataplus._M_p != &local_338.field_2) {
              operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar6) goto LAB_0023bd8e;
            bVar6 = false;
          }
LAB_0023bd94:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          if ((pointer)local_2f8._0_8_ != (pointer)(local_2f8 + 0x10)) {
            operator_delete((void *)local_2f8._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_2f8._16_8_)->_M_p + 1));
          }
          cmsys::Glob::~Glob((Glob *)local_90);
          std::__cxx11::
          _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_clear(&local_2d0);
          if (!bVar6) goto LAB_0023bf42;
          pbVar13 = local_238 + 2;
        } while (pbVar13 !=
                 local_2b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2b8);
      iVar15 = 1;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 "CPACK_INSTALLED_DIRECTORIES should contain pairs of <directory> and <subdirectory>. The <subdirectory> can be \'.\' to be installed in the toplevel directory of installation."
                 ,0xac);
      std::ios::widen((char)(ostream *)local_208 + (char)*(undefined8 *)(local_208._0_8_ + -0x18));
      std::ostream::put((char)local_208);
      std::ostream::flush();
      pcVar2 = local_360->Logger;
      std::__cxx11::stringbuf::str();
      uVar14 = local_90._0_8_;
      sVar9 = strlen((char *)local_90._0_8_);
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x15d,(char *)uVar14,sVar9);
      if ((GlobInternals *)local_90._0_8_ != (GlobInternals *)(local_90 + 0x10)) {
        operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
      std::ios_base::~ios_base(local_198);
LAB_0023bf42:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2b8);
      iVar15 = 0;
    }
  }
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
            (&local_258);
  return iVar15;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstalledDirectories(
  bool setDestDir, const std::string& tempInstallDirectory)
{
  (void)setDestDir;
  (void)tempInstallDirectory;
  std::vector<cmsys::RegularExpression> ignoreFilesRegex;
  const char* cpackIgnoreFiles = this->GetOption("CPACK_IGNORE_FILES");
  if ( cpackIgnoreFiles )
    {
    std::vector<std::string> ignoreFilesRegexString;
    cmSystemTools::ExpandListArgument(cpackIgnoreFiles,
                                      ignoreFilesRegexString);
    std::vector<std::string>::iterator it;
    for ( it = ignoreFilesRegexString.begin();
      it != ignoreFilesRegexString.end();
      ++it )
      {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
        "Create ignore files regex for: " << *it << std::endl);
      ignoreFilesRegex.push_back(it->c_str());
      }
    }
  const char* installDirectories
    = this->GetOption("CPACK_INSTALLED_DIRECTORIES");
  if ( installDirectories && *installDirectories )
    {
    std::vector<std::string> installDirectoriesVector;
    cmSystemTools::ExpandListArgument(installDirectories,
      installDirectoriesVector);
    if ( installDirectoriesVector.size() % 2 != 0 )
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
        "CPACK_INSTALLED_DIRECTORIES should contain pairs of <directory> and "
        "<subdirectory>. The <subdirectory> can be '.' to be installed in "
        "the toplevel directory of installation." << std::endl);
      return 0;
      }
    std::vector<std::string>::iterator it;
    const std::string& tempDir = tempInstallDirectory;
    for ( it = installDirectoriesVector.begin();
      it != installDirectoriesVector.end();
      ++it )
      {
      std::list<std::pair<std::string,std::string> > symlinkedFiles;
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
      cmsys::Glob gl;
      std::string top = *it;
      it ++;
      std::string subdir = *it;
      std::string findExpr = top;
      findExpr += "/*";
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
        "- Install directory: " << top << std::endl);
      gl.RecurseOn();
      gl.SetRecurseListDirs(true);
      if ( !gl.FindFiles(findExpr) )
        {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
          "Cannot find any files in the installed directory" << std::endl);
        return 0;
        }
      files = gl.GetFiles();
      std::vector<std::string>::iterator gfit;
      std::vector<cmsys::RegularExpression>::iterator regIt;
      for ( gfit = files.begin(); gfit != files.end(); ++ gfit )
        {
        bool skip = false;
        std::string inFile = *gfit;
        if(cmSystemTools::FileIsDirectory(*gfit))
          {
          inFile += '/';
          }
        for ( regIt= ignoreFilesRegex.begin();
          regIt!= ignoreFilesRegex.end();
          ++ regIt)
          {
          if ( regIt->find(inFile.c_str()) )
            {
            cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Ignore file: "
              << inFile << std::endl);
            skip = true;
            }
          }
        if ( skip )
          {
          continue;
          }
        std::string filePath = tempDir;
        filePath += "/" + subdir + "/"
          + cmSystemTools::RelativePath(top.c_str(), gfit->c_str());
        cmCPackLogger(cmCPackLog::LOG_DEBUG, "Copy file: "
          << inFile << " -> " << filePath << std::endl);
        /* If the file is a symlink we will have to re-create it */
        if ( cmSystemTools::FileIsSymlink(inFile))
          {
          std::string targetFile;
          std::string inFileRelative =
             cmSystemTools::RelativePath(top.c_str(),inFile.c_str());
          cmSystemTools::ReadSymlink(inFile,targetFile);
          symlinkedFiles.push_back(std::pair<std::string,
                                   std::string>(targetFile,inFileRelative));
          }
        /* If it is not a symlink then do a plain copy */
        else if (!(
            cmSystemTools::CopyFileIfDifferent(inFile.c_str(),filePath.c_str())
            &&
            cmSystemTools::CopyFileTime(inFile.c_str(),filePath.c_str())
                ) )
          {
          cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem copying file: "
            << inFile << " -> " << filePath << std::endl);
          return 0;
          }
        }
      /* rebuild symlinks in the installed tree */
      if (!symlinkedFiles.empty())
        {
        std::list< std::pair<std::string,std::string> >::iterator symlinkedIt;
        std::string curDir = cmSystemTools::GetCurrentWorkingDirectory();
        std::string goToDir = tempDir;
        goToDir  += "/"+subdir;
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "Change dir to: " << goToDir <<std::endl);
        cmSystemTools::ChangeDirectory(goToDir);
        for (symlinkedIt=symlinkedFiles.begin();
             symlinkedIt != symlinkedFiles.end();
             ++symlinkedIt)
          {
          cmCPackLogger(cmCPackLog::LOG_DEBUG, "Will create a symlink: "
                         << symlinkedIt->second << "--> "
                         << symlinkedIt->first << std::endl);
          // make sure directory exists for symlink
          std::string destDir =
            cmSystemTools::GetFilenamePath(symlinkedIt->second);
          if(!destDir.empty() && !cmSystemTools::MakeDirectory(destDir))
            {
            cmCPackLogger(cmCPackLog::LOG_ERROR, "Cannot create dir: "
                          << destDir
                          << "\nTrying to create symlink: "
                          << symlinkedIt->second << "--> "
                          << symlinkedIt->first
                          << std::endl);
            }
          if (!cmSystemTools::CreateSymlink(symlinkedIt->first,
                                            symlinkedIt->second))
            {
            cmCPackLogger(cmCPackLog::LOG_ERROR, "Cannot create symlink: "
                            << symlinkedIt->second << "--> "
                            << symlinkedIt->first << std::endl);
            return 0;
            }
          }
        cmCPackLogger(cmCPackLog::LOG_DEBUG, "Going back to: "
                      << curDir <<std::endl);
        cmSystemTools::ChangeDirectory(curDir);
        }
      }
    }
  return 1;
}